

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

int __thiscall jpgd::jpeg_decoder::locate_sos_marker(jpeg_decoder *this)

{
  int iVar1;
  int iVar2;
  
  iVar1 = process_markers(this);
  iVar2 = 0;
  if (iVar1 != 0xd9) {
    if (iVar1 != 0xda) {
      stop_decoding(this,JPGD_UNEXPECTED_MARKER);
    }
    read_sos_marker(this);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int jpeg_decoder::locate_sos_marker()
	{
		int c;

		c = process_markers();

		if (c == M_EOI)
			return JPGD_FALSE;
		else if (c != M_SOS)
			stop_decoding(JPGD_UNEXPECTED_MARKER);

		read_sos_marker();

		return JPGD_TRUE;
	}